

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O1

pboolean p_shm_lock(PShm *shm,PError **error)

{
  pboolean pVar1;
  
  if (shm != (PShm *)0x0) {
    pVar1 = p_semaphore_acquire(shm->sem,error);
    return pVar1;
  }
  p_shm_lock_cold_1();
  return 0;
}

Assistant:

P_LIB_API pboolean
p_shm_lock (PShm	*shm,
	    PError	**error)
{
	if (P_UNLIKELY (shm == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	return p_semaphore_acquire (shm->sem, error);
}